

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::setDrawBuffers(GLFrameBuffer *this)

{
  PFNGLDRAWBUFFERSPROC p_Var1;
  reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffs;
  value_type_conflict3 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  GLsizei GVar3;
  int local_24;
  
  (**(code **)((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start + 4))();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4e8f73);
  for (local_24 = 0; p_Var1 = glad_glDrawBuffers,
      local_24 <
      *(int *)((long)&in_RDI[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      local_24 = local_24 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  if (0 < *(int *)((long)&in_RDI[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4)) {
    GVar3 = *(GLsizei *)
             ((long)&in_RDI[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(GVar3,in_stack_ffffffffffffffb0));
    (*p_Var1)(GVar3,pvVar2);
  }
  checkGLError(this._7_1_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RDI);
  return;
}

Assistant:

void GLFrameBuffer::setDrawBuffers() {
  bind();

  std::vector<GLenum> buffs;
  for (int i = 0; i < nColorBuffers; i++) {
    buffs.push_back(GL_COLOR_ATTACHMENT0 + i);
  }
  if (nColorBuffers > 0) {
    glDrawBuffers(nColorBuffers, &buffs.front());
  }
  checkGLError();
}